

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Emote(Map *this,Character *from,Emote emote,bool echo)

{
  Character *other;
  bool bVar1;
  int num;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  PacketBuilder::PacketBuilder(&local_60,PACKET_EMOTE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&local_60,num);
  PacketBuilder::AddChar(&local_60,(uint)emote);
  p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->characters) {
    do {
      other = (Character *)p_Var2[1]._M_next;
      if (echo) {
LAB_00175973:
        Character::Send(other,&local_60);
      }
      else if (other != from) {
        bVar1 = Character::InRange(from,other);
        if (bVar1) goto LAB_00175973;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->characters);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Map::Emote(Character *from, enum Emote emote, bool echo)
{
	PacketBuilder builder(PACKET_EMOTE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(emote);

	UTIL_FOREACH(this->characters, character)
	{
		if (!echo && (character == from || !from->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}